

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_util_release_mmaped_file(void *pMap,unqlite_int64 iFileSize)

{
  jx9_vfs *pjVar1;
  int local_2c;
  int rc;
  jx9_vfs *pVfs;
  unqlite_int64 iFileSize_local;
  void *pMap_local;
  
  local_2c = 0;
  if (pMap == (void *)0x0) {
    pMap_local._4_4_ = 0;
  }
  else {
    pjVar1 = jx9ExportBuiltinVfs();
    if ((pjVar1 == (jx9_vfs *)0x0) || (pjVar1->xUnmap == (_func_void_void_ptr_jx9_int64 *)0x0)) {
      local_2c = -0x11;
    }
    else {
      (*pjVar1->xUnmap)(pMap,iFileSize);
    }
    pMap_local._4_4_ = local_2c;
  }
  return pMap_local._4_4_;
}

Assistant:

UNQLITE_APIEXPORT int unqlite_util_release_mmaped_file(void *pMap,unqlite_int64 iFileSize)
{
	const jx9_vfs *pVfs;
	int rc = UNQLITE_OK;
	if( pMap == 0 ){
		return UNQLITE_OK;
	}
	/* Extract the Jx9 Vfs */
	pVfs = jx9ExportBuiltinVfs();
	if( pVfs == 0 || pVfs->xUnmap == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	 }else{ 
		 pVfs->xUnmap(pMap,iFileSize);
	 }
	return rc;
}